

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

Qiniu_Error
Qiniu_Io_PutStream(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,void *ctx,
                  size_t fsize,rdFunc rdr,Qiniu_Io_PutExtra *extra)

{
  Qiniu_Json **ret_00;
  Qiniu_Io_PutExtra *pQVar1;
  Qiniu_Bool QVar2;
  uint code;
  Qiniu_Retry_Decision QVar3;
  CURL *curl;
  char *pcVar4;
  char *extraout_RDX;
  char cVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  Qiniu_Error QVar10;
  size_t local_90;
  undefined8 local_88;
  curl_httppost *local_80;
  Qiniu_Io_PutExtra *local_78;
  char *bucketName;
  char *accessKey;
  char **upHosts;
  Qiniu_Buffer *local_58;
  Qiniu_Buffer *local_50;
  char *defaultUpHosts [1];
  Qiniu_Io_form form;
  
  accessKey = (char *)0x0;
  bucketName = (char *)0x0;
  QVar2 = Qiniu_Utils_Extract_Bucket(uptoken,&accessKey,&bucketName);
  if (QVar2 == 0) {
    pcVar7 = "parse uptoken failed";
    uVar8 = 400;
  }
  else {
    Qiniu_Io_form_init(&form,uptoken,key,&extra);
    curl_formadd(&form,&form.lastptr,1,"file",0x10,"filename",0x13,ctx,6,fsize,0x11);
    pcVar4 = accessKey;
    pcVar7 = bucketName;
    pQVar1 = extra;
    local_80 = form.formpost;
    defaultUpHosts[0] = QINIU_UP_HOST;
    local_88 = curl_slist_append(0,"Expect:");
    local_78 = pQVar1;
    QVar10 = _Qiniu_Get_UpHosts(self,pcVar4,pcVar7,pQVar1,&upHosts,&local_90);
    pcVar7 = QVar10.message;
    if (QVar10.code == 200) {
      if (local_90 == 0) {
        upHosts = defaultUpHosts;
        local_90 = 1;
      }
      local_50 = &self->b;
      ret_00 = &self->root;
      local_58 = &self->respHeader;
      uVar6 = 0;
      do {
        curl = Qiniu_Client_reset(self);
        QVar10 = Qiniu_Client_config(self);
        pcVar7 = QVar10.message;
        if (QVar10.code == 200) {
          curl_easy_setopt(curl,0x2712,upHosts[uVar6 % local_90]);
          curl_easy_setopt(curl,0x2728,local_80);
          curl_easy_setopt(curl,0x2727,local_88);
          curl_easy_setopt(curl,0x4e2c,rdr);
          pQVar1 = local_78;
          bVar9 = local_78->uploadingProgress == (_func_void_size_t_size_t *)0x0;
          if (!bVar9) {
            curl_easy_setopt(curl,0x4e58,_Qiniu_Progress_Callback);
            curl_easy_setopt(curl,0x2749,pQVar1->uploadingProgress);
          }
          curl_easy_setopt(curl,0x2b,bVar9);
          QVar10 = Qiniu_callex(curl,local_50,ret_00,0,local_58);
          pcVar7 = QVar10.message;
          code = QVar10.code;
          if (code == 200) {
            if (local_78->callbackRetParser == (_func_Qiniu_Error_void_ptr_Qiniu_Json_ptr *)0x0) {
              uVar8 = 200;
              cVar5 = '\x02';
              if (ret != (Qiniu_Io_PutRet *)0x0) {
                bVar9 = false;
                pcVar4 = Qiniu_Json_GetString(*ret_00,"hash",(char *)0x0);
                ret->hash = pcVar4;
                pcVar4 = Qiniu_Json_GetString(*ret_00,"key",(char *)0x0);
                ret->key = pcVar4;
                goto LAB_00123c2f;
              }
            }
            else {
              QVar10 = (*local_78->callbackRetParser)(local_78->callbackRet,*ret_00);
              uVar8 = (ulong)(uint)QVar10;
              cVar5 = '\x02';
              pcVar7 = extraout_RDX;
            }
            goto LAB_00123c13;
          }
          uVar8 = (ulong)code;
          QVar3 = _Qiniu_Should_Retry(code);
          bVar9 = QVar3 != QINIU_DONT_RETRY;
          cVar5 = (QVar3 == QINIU_DONT_RETRY) * '\x02';
        }
        else {
          uVar8 = (ulong)(uint)QVar10.code;
          cVar5 = '\x01';
LAB_00123c13:
          bVar9 = false;
        }
LAB_00123c2f:
        if (!bVar9) goto LAB_00123cbd;
        uVar6 = uVar6 + 1;
      } while (uVar6 <= self->hostsRetriesMax);
      cVar5 = '\x02';
LAB_00123cbd:
      if (cVar5 == '\x02') {
        curl_formfree(local_80);
        curl_slist_free_all(local_88);
      }
    }
    else {
      uVar8 = (ulong)(uint)QVar10.code;
    }
    Qiniu_Free(accessKey);
    Qiniu_Free(bucketName);
  }
  QVar10.message = pcVar7;
  QVar10._0_8_ = uVar8;
  return QVar10;
}

Assistant:

Qiniu_Error Qiniu_Io_PutStream(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key,
    void *ctx, size_t fsize, rdFunc rdr,
    Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    const char *accessKey = NULL, *bucketName = NULL;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form form;
    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    if (key == NULL)
    {
        // Use an empty string instead of the NULL pointer to prevent the curl lib from crashing
        // when read it.
        // **NOTICE**: The magic variable $(filename) will be set as empty string.
        key = "";
    }

    // Add 'filename' property to make it like a file upload one
    // Otherwise it may report: CURL_ERROR(18) or "multipart/message too large"
    // See https://curl.haxx.se/libcurl/c/curl_formadd.html#CURLFORMSTREAM
    // FIXED by fengyh 2017-03-22 10:30
    curl_formadd(
        &form.formpost, &form.lastptr,
        CURLFORM_COPYNAME, "file",
        CURLFORM_FILENAME, "filename",
        CURLFORM_STREAM, ctx,
        CURLFORM_CONTENTSLENGTH, fsize,
        CURLFORM_END);

    err = Qiniu_Io_call_with_callback(self, accessKey, bucketName, ret, form.formpost, rdr, extra);
error:
    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}